

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O0

bool __thiscall ki::protocol::net::ClientSession::is_alive(ClientSession *this)

{
  rep rVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  duration<long,_std::ratio<1L,_1L>_> local_38;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<long,_std::ratio<1L,_1L>_> local_20;
  ClientSession *local_18;
  ClientSession *this_local;
  
  local_18 = this;
  if (((&this->field_0xa)[(long)this->_vptr_ClientSession[-3]] & 1) == 0) {
    local_30.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_28.__r = (rep)std::chrono::operator-
                                  (&local_30,
                                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)(&this->field_0x10 + (long)this->_vptr_ClientSession[-3]));
    local_20.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_28);
    rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_20);
    this_local._7_1_ = rVar1 < 7;
  }
  else {
    local_48.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_40.__r = (rep)std::chrono::operator-
                                  (&local_48,
                                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)(&this->field_0x28 + (long)this->_vptr_ClientSession[-3]));
    local_38.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_40);
    rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_38);
    this_local._7_1_ = rVar1 < 0x79;
  }
  return this_local._7_1_;
}

Assistant:

bool ClientSession::is_alive() const
	{
		// If the session isn't established yet, use the time of
		// creation to decide whether this session is alive.
		if (!m_established)
			return std::chrono::duration_cast<std::chrono::seconds>(
				std::chrono::steady_clock::now() - m_creation_time
			).count() <= (KI_CONNECTION_TIMEOUT * 2);

		// Otherwise, use the last time we received a heartbeat.
		return std::chrono::duration_cast<std::chrono::seconds>(
			std::chrono::steady_clock::now() - m_last_received_heartbeat_time
		).count() <= (KI_SERVER_HEARTBEAT * 2);
	}